

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar2
  ;
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar2->fadexpr_).right_;
  pFVar5 = (pFVar3->fadexpr_).right_;
  dVar1 = (this->left_->fadexpr_).left_.constant_;
  pFVar6 = (this->right_->fadexpr_).right_;
  return ((pFVar3->fadexpr_).left_.constant_ + pFVar5->val_ + pFVar4->val_) * dVar1 *
         (pFVar6->dx_).ptr_to_data[i] +
         ((this->right_->fadexpr_).left_.constant_ + pFVar6->val_) *
         ((pFVar5->dx_).ptr_to_data[i] + (pFVar4->dx_).ptr_to_data[i]) * dVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}